

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::skryjNa30(Sudoku *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_1d8;
  int i;
  int n;
  int y;
  int x;
  Sudoku temp;
  Sudoku *this_local;
  
  temp.s._436_8_ = this;
  Sudoku((Sudoku *)&y,-1);
  do {
    initPole((Sudoku *)&y);
    for (local_1d8 = 0; local_1d8 < 0x1e; local_1d8 = local_1d8 + 1) {
      do {
        iVar1 = rand();
        iVar1 = iVar1 % 0x51;
      } while ((*(byte *)(&y + iVar1) & 0xf) != 0);
      *(byte *)(&y + iVar1) = *(byte *)(&y + iVar1) & 0xf0 | *(byte *)((this->s).pole + iVar1) & 0xf
      ;
      *(byte *)(&y + iVar1) = *(byte *)(&y + iVar1) & 0xef | 0x10;
      iVar3 = iVar1 % 9;
      iVar2 = iVar1 / 9;
      temp.s.sloupce[(long)iVar2 + 7] =
           1 << (*(byte *)((this->s).pole + iVar1) & 0xf) | temp.s.sloupce[(long)iVar2 + 7];
      temp.s.sloupce[(long)iVar3 + -2] =
           1 << (*(byte *)((this->s).pole + iVar1) & 0xf) | temp.s.sloupce[(long)iVar3 + -2];
      temp.s.ctverce[(long)(iVar3 / 3) + -1][(long)(iVar2 / 3) + 1] =
           1 << (*(byte *)((this->s).pole + iVar1) & 0xf) |
           temp.s.ctverce[(long)(iVar3 / 3) + -1][(long)(iVar2 / 3) + 1];
    }
    temp.s.ctverce[2][2] = 0x1e;
    iVar1 = jednoducheReseni((Sudoku *)&y);
  } while (iVar1 == 0);
  memcpy(this,&y,0x1bc);
  ~Sudoku((Sudoku *)&y);
  return;
}

Assistant:

void Sudoku::skryjNa30()
{
  Sudoku temp(-1); // vytvorime prazdne sudoku
  int x,y;
  do
  {
    temp.initPole(); // uplne vyprazdnime docasne sudoku
    // hledame 30 poli
    for (int n=0; n<30; n++)
    {
      int i;
      do
      {
        i = rand() % 81;
      } while (temp.s.pole[i].zapsane); // najdeme v docasnem sudoku nahodne prazdne policko
      // preneseme z naseho sudoku cislo do docasneho
      temp.s.pole[i].zapsane = s.pole[i].zapsane;
      temp.s.pole[i].pevne = true;// generujeme, vse pevne
      x = i % 9;
      y = i / 9;
      // zakazeme pouzit v radcich/sloupcich/ctvercich vyplnene pole
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
    }
    temp.s.doplnenych = 30; // vyplnili jsme 30 policek
  } while (!temp.jednoducheReseni()); // dokud se neda sudoku vyresit jednoduchym doplnovanim
  s = temp.s;// preneseni stavu z docasneho sudoku
}